

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzclose_w(gzFile file)

{
  int iVar1;
  char *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  gz_state *state;
  int ret;
  zng_stream *in_stack_ffffffffffffffd8;
  int32_t local_14;
  char *msg;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  local_14 = 0;
  if (in_RDI == (char *)0x0) {
    local_14 = -2;
  }
  else if (*(int *)(in_RDI + 0x18) == 0x79b1) {
    msg = in_RDI;
    if (*(int *)(in_RDI + 0x70) != 0) {
      in_RDI[0x70] = '\0';
      in_RDI[0x71] = '\0';
      in_RDI[0x72] = '\0';
      in_RDI[0x73] = '\0';
      iVar1 = gz_zero((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (off64_t)in_RDI);
      if (iVar1 == -1) {
        local_14 = *(int32_t *)(in_RDI + 0x74);
      }
    }
    iVar1 = gz_comp(state,unaff_retaddr_00);
    if (iVar1 == -1) {
      local_14 = *(int32_t *)(in_RDI + 0x74);
    }
    if (*(int *)(in_RDI + 0x28) != 0) {
      if (*(int *)(in_RDI + 0x40) == 0) {
        zng_deflateEnd(in_stack_ffffffffffffffd8);
        zng_free((void *)0x14784d);
      }
      zng_free((void *)0x14785b);
    }
    gz_error((gz_state *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,msg);
    free(*(void **)(in_RDI + 0x20));
    iVar1 = close(*(int *)(in_RDI + 0x1c));
    if (iVar1 == -1) {
      local_14 = -1;
    }
    zng_free((void *)0x14789d);
  }
  else {
    local_14 = -2;
  }
  return local_14;
}

Assistant:

int Z_EXPORT PREFIX(gzclose_w)(gzFile file) {
    int ret = Z_OK;
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;

    /* check that we're writing */
    if (state->mode != GZ_WRITE)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            ret = state->err;
    }

    /* flush, free memory, and close file */
    if (gz_comp(state, Z_FINISH) == -1)
        ret = state->err;
    if (state->size) {
        if (!state->direct) {
            (void)PREFIX(deflateEnd)(&(state->strm));
            zng_free(state->out);
        }
        zng_free(state->in);
    }
    gz_error(state, Z_OK, NULL);
    free(state->path);
    if (close(state->fd) == -1)
        ret = Z_ERRNO;
    zng_free(state);
    return ret;
}